

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_SendReportedState
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,uchar *reportedState,size_t size,
          IOTHUB_CLIENT_REPORTED_STATE_CALLBACK reportedStateCallback,void *userContextCallback)

{
  uint32_t uVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  uint32_t *__ptr;
  CONSTBUFFER_HANDLE constbufferHandle;
  IOTHUB_CLIENT_RESULT IVar4;
  uint32_t uVar5;
  
  if ((reportedState == (uchar *)0x0 || iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) ||
      size == 0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      IVar4 = IOTHUB_CLIENT_INVALID_ARG;
    }
    else {
      IVar4 = IOTHUB_CLIENT_INVALID_ARG;
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_SendReportedState",0x998,1,
                "Invalid argument specified iothubClientHandle=%p, reportedState=%p, size=%lu",
                iotHubClientHandle,reportedState,size);
    }
  }
  else {
    uVar1 = iotHubClientHandle->data_msg_id + 1;
    uVar5 = 1;
    if (uVar1 != 0xffffffff) {
      uVar5 = uVar1;
    }
    iotHubClientHandle->data_msg_id = uVar5;
    __ptr = (uint32_t *)malloc(0x48);
    if (__ptr == (uint32_t *)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"dev_twin_data_create",0x4d7,1,"Failure allocating device twin information");
      }
    }
    else {
      constbufferHandle = CONSTBUFFER_Create(reportedState,size);
      *(CONSTBUFFER_HANDLE *)(__ptr + 6) = constbufferHandle;
      if (constbufferHandle != (CONSTBUFFER_HANDLE)0x0) {
        *__ptr = uVar5;
        __ptr[2] = 0;
        __ptr[3] = 0;
        *(void **)(__ptr + 8) = userContextCallback;
        *(IOTHUB_CLIENT_REPORTED_STATE_CALLBACK *)(__ptr + 4) = reportedStateCallback;
        *(IOTHUB_CLIENT_CORE_LL_HANDLE *)(__ptr + 0xe) = iotHubClientHandle;
        *(IOTHUB_DEVICE_HANDLE *)(__ptr + 0x10) = iotHubClientHandle->deviceHandle;
        iVar2 = (*iotHubClientHandle->IoTHubTransport_Subscribe_DeviceTwin)
                          (iotHubClientHandle->transportHandle);
        if (iVar2 != 0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_SendReportedState",0x9a7,1,
                      "Failure adding device twin data to queue");
          }
          CONSTBUFFER_DecRef(constbufferHandle);
          free(__ptr);
          return IOTHUB_CLIENT_ERROR;
        }
        DList_InsertTailList(&iotHubClientHandle->iot_msg_queue,(PDLIST_ENTRY)(__ptr + 10));
        return IOTHUB_CLIENT_OK;
      }
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"dev_twin_data_create",0x4c7,1,"Failure allocating reported state data");
      }
      free(__ptr);
    }
    p_Var3 = xlogging_get_log_function();
    IVar4 = IOTHUB_CLIENT_ERROR;
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_SendReportedState",0x9a0,1,
                "Failure constructing device twin data");
    }
  }
  return IVar4;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_SendReportedState(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, const unsigned char* reportedState, size_t size, IOTHUB_CLIENT_REPORTED_STATE_CALLBACK reportedStateCallback, void* userContextCallback)
{
    IOTHUB_CLIENT_RESULT result;
    if (iotHubClientHandle == NULL || (reportedState == NULL || size == 0) )
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
        LogError("Invalid argument specified iothubClientHandle=%p, reportedState=%p, size=%lu", iotHubClientHandle, reportedState, (unsigned long)size);
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;
        IOTHUB_DEVICE_TWIN* client_data = dev_twin_data_create(handleData, get_next_item_id(handleData), reportedState, size, reportedStateCallback, userContextCallback);
        if (client_data == NULL)
        {
            LogError("Failure constructing device twin data");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            if (handleData->IoTHubTransport_Subscribe_DeviceTwin(handleData->transportHandle) != 0)
            {
                LogError("Failure adding device twin data to queue");
                device_twin_data_destroy(client_data);
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                DList_InsertTailList(&(iotHubClientHandle->iot_msg_queue), &(client_data->entry));

                result = IOTHUB_CLIENT_OK;
            }
        }
    }
    return result;
}